

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,int,double,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,true,false>
               (double *ldata,int *rdata,double *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double lentry;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar11 = *ldata;
      iVar6 = 0;
      do {
        dVar10 = (double)rdata[iVar6];
        if (rdata[iVar6] < 0) {
          dVar10 = pow(10.0,-dVar10);
          dVar9 = round(dVar11 / dVar10);
          dVar9 = dVar9 * dVar10;
          dVar10 = 0.0;
        }
        else {
          dVar10 = pow(10.0,dVar10);
          dVar9 = round(dVar11 * dVar10);
          dVar9 = dVar9 / dVar10;
          dVar10 = dVar11;
        }
        if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
          dVar10 = dVar9;
        }
        result_data[iVar6] = dVar10;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar8 = count;
        }
LAB_006e161d:
        uVar3 = uVar4;
        if (uVar4 < uVar8) {
          dVar11 = *ldata;
          do {
            dVar10 = (double)rdata[uVar4];
            if (rdata[uVar4] < 0) {
              dVar10 = pow(10.0,-dVar10);
              dVar9 = round(dVar11 / dVar10);
              dVar9 = dVar9 * dVar10;
              dVar10 = 0.0;
            }
            else {
              dVar10 = pow(10.0,dVar10);
              dVar9 = round(dVar11 * dVar10);
              dVar9 = dVar9 / dVar10;
              dVar10 = dVar11;
            }
            if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
              dVar10 = dVar9;
            }
            result_data[uVar4] = dVar10;
            uVar4 = uVar4 + 1;
            uVar3 = uVar8;
          } while (uVar8 != uVar4);
        }
      }
      else {
        uVar2 = puVar1[uVar7];
        uVar8 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar8 = count;
        }
        uVar3 = uVar8;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_006e161d;
          uVar3 = uVar4;
          if (uVar4 < uVar8) {
            uVar5 = 0;
            do {
              if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
                dVar11 = *ldata;
                dVar10 = (double)rdata[uVar4 + uVar5];
                if (rdata[uVar4 + uVar5] < 0) {
                  dVar10 = pow(10.0,-dVar10);
                  dVar9 = round(dVar11 / dVar10);
                  dVar9 = dVar9 * dVar10;
                  dVar11 = 0.0;
                }
                else {
                  dVar10 = pow(10.0,dVar10);
                  dVar9 = round(dVar11 * dVar10);
                  dVar9 = dVar9 / dVar10;
                }
                if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
                  dVar11 = dVar9;
                }
                result_data[uVar4 + uVar5] = dVar11;
              }
              uVar5 = uVar5 + 1;
              uVar3 = uVar8;
            } while (uVar8 - uVar4 != uVar5);
          }
        }
      }
      uVar4 = uVar3;
      uVar7 = uVar7 + 1;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}